

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::default_impl_override::test_method(default_impl_override *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  service *psVar4;
  undefined4 extraout_var;
  unique_id local_138;
  undefined8 local_130;
  basic_cstring<const_char> local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_118;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  undefined1 local_d0 [8];
  injected<Inject::service> actual;
  context<0> c;
  provides<Inject::service> zz;
  component<Inject::impl2> z;
  provides<Inject::service> yy;
  component<Inject::impl1> y;
  implemented_by<Inject::impl1,_(inject::component_scope)0> local_20;
  implemented_by<Inject::impl1,_(inject::component_scope)0> xx;
  component<Inject::service> x;
  default_impl_override *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::implemented_by(&local_20);
  inject::context<0>::component<Inject::impl1>::component((component<Inject::impl1> *)&yy);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&z);
  inject::context<0>::component<Inject::impl2>::component((component<Inject::impl2> *)&zz);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)&actual._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl2>((context<0> *)&actual._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x13f,&local_f0);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_118,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar4 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_d0);
    iVar3 = (**psVar4->_vptr_service)();
    local_130 = CONCAT44(extraout_var,iVar3);
    local_138 = inject::id_of<Inject::impl2>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_118,&local_128,0x13f,1,2,&local_130,"actual->id()",&local_138,
               "id_of<impl2>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_118);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_d0);
  inject::context<0>::~context((context<0> *)&actual._ptr.pn);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl2>::~component((component<Inject::impl2> *)&zz);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&z);
  inject::context<0>::component<Inject::impl1>::~component((component<Inject::impl1> *)&yy);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::~implemented_by(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_impl_override)
{
    context<>::component<service> x;
    context<>::component<service>::implemented_by<impl1> xx;

    context<>::component<impl1> y;
    context<>::component<impl1>::provides<service> yy;
    
    context<>::component<impl2> z;
    context<>::component<impl2>::provides<service> zz;

    context<> c;
    c.bind<service, impl2>();

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl2>::id());
}